

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O1

void __thiscall
BayesianGameWithClusterInfo::BayesianGameWithClusterInfo
          (BayesianGameWithClusterInfo *this,PlanningUnitDecPOMDPDiscrete *pu,
          QFunctionJAOHInterface *q,shared_ptr<const_PartialJointPolicyDiscretePure> *pastJPol,
          BGClusterAlgorithm clusterAlg)

{
  value_type_conflict1 *pvVar1;
  _func_int *p_Var2;
  PlanningUnitDecPOMDPDiscrete *pPVar3;
  element_type *peVar4;
  pointer ppvVar5;
  vector<TypeCluster*,std::allocator<TypeCluster*>> *this_00;
  iterator __position;
  pointer puVar6;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *pvVar7;
  undefined8 uVar8;
  size_t *step_size;
  vector<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*,std::allocator<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*>>
  *this_01;
  pointer puVar9;
  undefined1 auVar10 [8];
  int iVar11;
  Index IVar12;
  uint uVar13;
  QFunctionJointBeliefInterface *pQVar14;
  QHybrid *pQVar15;
  undefined4 extraout_var;
  LIndex i;
  undefined4 extraout_var_00;
  pointer puVar16;
  ulong uVar17;
  undefined8 *puVar18;
  TypeCluster *pTVar19;
  size_t sVar20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar21;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar22;
  undefined1 *puVar23;
  ulong uVar24;
  ulong uVar25;
  Index *oIs;
  uint *puVar26;
  ulong uVar27;
  BayesianGameBase *this_02;
  uint uVar28;
  undefined1 auStack_e8 [8];
  shared_ptr<const_PartialJointPolicyDiscretePure> *local_e0;
  ulong local_d8;
  undefined1 *local_d0;
  undefined **local_c8;
  undefined8 local_c0;
  ulong local_b8;
  vector<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*,std::allocator<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*>>
  *local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a8;
  BayesianGameBase *local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  TypeCluster *local_80;
  TypeCluster *tc;
  pointer puStack_70;
  pointer local_68;
  ulong local_60;
  undefined1 auStack_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indAOHs;
  
  puVar23 = auStack_e8;
  local_e0 = pastJPol;
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (&this->super_BayesianGameForDecPOMDPStage,pu,q,pastJPol);
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
  _vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameWithClusterInfo_005a1720;
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
  super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)&PTR__BayesianGameWithClusterInfo_005a1770
  ;
  (this->_m_pBG).px = (element_type *)0x0;
  (this->_m_pBG).pn.pi_ = (sp_counted_base *)0x0;
  if (q == (QFunctionJAOHInterface *)0x0) {
    pQVar14 = (QFunctionJointBeliefInterface *)0x0;
  }
  else {
    pQVar14 = (QFunctionJointBeliefInterface *)
              __dynamic_cast(q,&QFunctionJAOHInterface::typeinfo,
                             &QFunctionJointBeliefInterface::typeinfo,0xfffffffffffffffe);
  }
  this->_m_qJB = pQVar14;
  if (q == (QFunctionJAOHInterface *)0x0) {
    pQVar15 = (QHybrid *)0x0;
  }
  else {
    pQVar15 = (QHybrid *)__dynamic_cast(q,&QFunctionJAOHInterface::typeinfo,&QHybrid::typeinfo,0);
  }
  local_a0 = (BayesianGameBase *)
             &(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff;
  this->_m_qHybrid = pQVar15;
  local_a8 = &this->_m_jaohReps;
  local_b0 = (vector<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*,std::allocator<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*>>
              *)&this->_m_typeLists;
  (this->_m_pBGJPol).px = (element_type *)0x0;
  (this->_m_pBGJPol).pn.pi_ = (sp_counted_base *)0x0;
  (this->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_m_typeLists).
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_typeLists).
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_typeLists).
  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_clusterAlgorithm = clusterAlg;
  this->_m_thresholdJB = (double)SUB168(ZEXT416(0) << 0x40,0);
  this->_m_thresholdPjaoh = (double)SUB168(ZEXT416(0) << 0x40,8);
  uVar28 = (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
           _m_t;
  local_60 = (ulong)uVar28;
  local_b8 = (ulong)(uVar28 - 1);
  local_c8 = &PTR__Type_005a1aa0;
  uVar28 = 0;
  while( true ) {
    this_02 = local_a0;
    p_Var2 = (local_a0->super_Interface_ProblemToPolicyDiscretePure).
             super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3];
    *(undefined8 *)(puVar23 + -8) = 0x37be90;
    iVar11 = (*p_Var2)(this_02);
    uVar25 = (ulong)uVar28;
    if (CONCAT44(extraout_var,iVar11) <= uVar25) {
      *(undefined8 *)(puVar23 + -8) = 0x37c1e4;
      sVar20 = BayesianGameBase::GetNrJointTypes(this_02);
      *(undefined8 *)(puVar23 + -8) = 0x37c1f7;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,sVar20,
                 (allocator_type *)&local_98);
      pvVar21 = local_a8;
      *(undefined8 *)(puVar23 + -8) = 0x37c20a;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pvVar21,auStack_58);
      auVar10 = auStack_58;
      if (auStack_58 != (undefined1  [8])0x0) {
        uVar25 = (long)indAOHs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58;
        *(undefined8 *)(puVar23 + -8) = 0x37c21e;
        operator_delete((void *)auVar10,uVar25);
      }
      uVar28 = 0;
      do {
        *(undefined8 *)(puVar23 + -8) = 0x37c236;
        sVar20 = BayesianGameBase::GetNrJointTypes(this_02);
        if (sVar20 <= uVar28) {
          return;
        }
        *(undefined8 *)(puVar23 + -8) = 0x37c24b;
        pvVar21 = BayesianGameBase::JointToIndividualTypeIndices(this_02,uVar28);
        p_Var2 = (this_02->super_Interface_ProblemToPolicyDiscretePure).
                 super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3];
        *(undefined8 *)(puVar23 + -8) = 0x37c257;
        iVar11 = (*p_Var2)(this_02);
        local_60 = (ulong)uVar28;
        *(undefined8 *)(puVar23 + -8) = 0x37c26e;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,
                   CONCAT44(extraout_var_01,iVar11),(allocator_type *)&local_98);
        uVar28 = 0;
        while( true ) {
          p_Var2 = (this_02->super_Interface_ProblemToPolicyDiscretePure).
                   super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete
                   [3];
          *(undefined8 *)(puVar23 + -8) = 0x37c279;
          iVar11 = (*p_Var2)(this_02);
          auVar10 = auStack_58;
          uVar25 = (ulong)uVar28;
          if (CONCAT44(extraout_var_02,iVar11) <= uVar25) break;
          puVar6 = (pvVar21->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(pvVar21->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish - (long)puVar6 >> 2) <= uVar25) {
            *(undefined8 *)(puVar23 + -8) = 0x37c3d4;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar25);
          }
          ppvVar5 = (this->_m_typeLists).
                    super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->_m_typeLists).
                            super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar5 >> 3) <=
              uVar25) {
            *(undefined8 *)(puVar23 + -8) = 0x37c3c3;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar25);
          }
          uVar24 = (ulong)puVar6[uVar25];
          pvVar7 = ppvVar5[uVar25];
          lVar22 = *(long *)&(pvVar7->
                             super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>).
                             _M_impl.super__Vector_impl_data;
          if ((ulong)((long)(pvVar7->
                            super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish - lVar22 >> 3) <= uVar24) {
            *(undefined8 *)(puVar23 + -8) = 0x37c3e2;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          if ((ulong)((long)indAOHs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 2) <=
              uVar25) {
            *(undefined8 *)(puVar23 + -8) = 0x37c3f3;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar25);
          }
          uVar8 = *(undefined8 *)(*(long *)(*(long *)(lVar22 + uVar24 * 8) + 0x18) + 0x20);
          *(undefined8 *)(puVar23 + -8) = 0x37c30e;
          lVar22 = __dynamic_cast(uVar8,&Type::typeinfo,&Type_AOHIndex::typeinfo,0);
          *(undefined4 *)
           (&(((set<Type_*,_std::less<Type_*>,_std::allocator<Type_*>_> *)auVar10)->_M_t)._M_impl.
             field_0x0 + uVar25 * 4) = *(undefined4 *)(lVar22 + 0xc);
          uVar28 = uVar28 + 1;
          this_02 = local_a0;
        }
        step_size = (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
                    super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                    _m_stepSizeTypes;
        *(undefined8 *)(puVar23 + -8) = 0x37c339;
        IVar12 = IndexTools::IndividualToJointIndicesStepSize
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,
                            step_size);
        auVar10 = auStack_58;
        uVar25 = local_60;
        this_02 = local_a0;
        puVar6 = (this->_m_jaohReps).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->_m_jaohReps).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar6 >> 2) <= local_60) {
          *(undefined1 **)(puVar23 + -8) = &LAB_0037c404;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar25);
        }
        puVar6[local_60] = IVar12;
        if (auStack_58 != (undefined1  [8])0x0) {
          uVar24 = (long)indAOHs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58;
          *(undefined8 *)(puVar23 + -8) = 0x37c37a;
          operator_delete((void *)auVar10,uVar24);
        }
        uVar28 = (int)uVar25 + 1;
      } while( true );
    }
    *(undefined8 *)(puVar23 + -8) = 0x37bea6;
    auStack_58 = (undefined1  [8])operator_new(0x18);
    this_01 = local_b0;
    *(undefined8 *)&(((TypeCluster *)auStack_58)->_m_types)._M_t._M_impl = 0;
    *(undefined8 *)
     &(((TypeCluster *)auStack_58)->_m_types)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (((TypeCluster *)auStack_58)->_m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    *(undefined8 *)(puVar23 + -8) = 0x37beca;
    std::
    vector<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*,std::allocator<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*>>
    ::emplace_back<std::vector<TypeCluster*,std::allocator<TypeCluster*>>*>
              (this_01,(vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> **)auStack_58);
    uVar24 = local_60;
    pPVar3 = (this->super_BayesianGameForDecPOMDPStage)._m_pu;
    *(undefined8 *)(puVar23 + -8) = 0x37bedd;
    i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                  (&pPVar3->super_PlanningUnitMADPDiscrete,uVar28,(Index)uVar24);
    *(undefined8 *)(puVar23 + -8) = 0x37bee5;
    IVar12 = Globals::CastLIndexToIndex(i);
    local_c0 = CONCAT44(extraout_var_00,IVar12);
    puVar16 = (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
              super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
                      super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar16 >> 3) <= uVar25) break;
    uVar24 = 0;
    while (uVar27 = local_60, uVar24 < puVar16[uVar25]) {
      auStack_58 = (undefined1  [8])0x0;
      indAOHs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      indAOHs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (local_60 != 0) {
        iVar11 = (int)local_c0;
        uVar17 = local_60 * 4 + 0xf & 0xfffffffffffffff0;
        oIs = (Index *)(puVar23 + -uVar17);
        puVar26 = (uint *)((long)oIs - uVar17);
        pPVar3 = (this->super_BayesianGameForDecPOMDPStage)._m_pu;
        local_d8 = uVar24;
        puVar26[-2] = 0x37bf8d;
        puVar26[-1] = 0;
        PlanningUnitMADPDiscrete::GetObservationHistoryArrays
                  (&pPVar3->super_PlanningUnitMADPDiscrete,uVar28,(int)uVar24 + iVar11,(Index)uVar27
                   ,oIs);
        uVar27 = 0;
        uVar24 = 0;
        local_d0 = puVar23;
        do {
          peVar4 = local_e0->px;
          p_Var2 = (peVar4->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
                   super_JointPolicy._vptr_JointPolicy[0x13];
          puVar26[-2] = 0x37bfb1;
          puVar26[-1] = 0;
          uVar13 = (*p_Var2)(peVar4,(ulong)uVar28,uVar24);
          puVar26[uVar27] = uVar13;
          IVar12 = oIs[uVar27];
          pPVar3 = (this->super_BayesianGameForDecPOMDPStage)._m_pu;
          puVar26[-2] = 0x37bfcf;
          puVar26[-1] = 0;
          IVar12 = PlanningUnitMADPDiscrete::GetSuccessorOHI
                             (&pPVar3->super_PlanningUnitMADPDiscrete,uVar28,(Index)uVar24,IVar12);
          uVar24 = (ulong)IVar12;
          uVar27 = uVar27 + 1;
        } while (local_60 != uVar27);
        pvVar1 = puVar26 + local_b8;
        puVar26[-2] = 0x37bff7;
        puVar26[-1] = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tc,(ulong)*puVar26,pvVar1
                   ,(allocator_type *)&local_80);
        puVar6 = indAOHs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        auVar10 = auStack_58;
        indAOHs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = local_68;
        auStack_58 = (undefined1  [8])tc;
        indAOHs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = puStack_70;
        _tc = ZEXT816(0) << 0x20;
        local_68 = (pointer)0x0;
        if (auVar10 != (undefined1  [8])0x0) {
          puVar26[-2] = 0x37c033;
          puVar26[-1] = 0;
          operator_delete((void *)auVar10,(long)puVar6 - (long)auVar10);
        }
        pTVar19 = tc;
        if (tc != (TypeCluster *)0x0) {
          uVar24 = (long)local_68 - (long)tc;
          puVar26[-2] = 0x37c048;
          puVar26[-1] = 0;
          operator_delete(pTVar19,uVar24);
        }
        uVar13 = *oIs;
        pvVar1 = oIs + local_b8;
        puVar26[-2] = 0x37c064;
        puVar26[-1] = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&tc,(ulong)uVar13,pvVar1,
                   (allocator_type *)&local_80);
        puVar9 = local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        puVar6 = local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_68;
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)tc;
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puStack_70;
        _tc = ZEXT816(0) << 0x20;
        local_68 = (pointer)0x0;
        if ((TypeCluster *)puVar6 != (TypeCluster *)0x0) {
          puVar26[-2] = 0x37c0a2;
          puVar26[-1] = 0;
          operator_delete(puVar6,(long)puVar9 - (long)puVar6);
        }
        pTVar19 = tc;
        puVar23 = local_d0;
        uVar24 = local_d8;
        if (tc != (TypeCluster *)0x0) {
          uVar24 = (long)local_68 - (long)tc;
          puVar26[-2] = 0x37c0b7;
          puVar26[-1] = 0;
          operator_delete(pTVar19,uVar24);
          puVar23 = local_d0;
          uVar24 = local_d8;
        }
      }
      uVar27 = local_60;
      pPVar3 = (this->super_BayesianGameForDecPOMDPStage)._m_pu;
      *(undefined8 *)(puVar23 + -8) = 0x37c0e6;
      IVar12 = PlanningUnitMADPDiscrete::GetActionObservationHistoryIndex
                         (&pPVar3->super_PlanningUnitMADPDiscrete,uVar28,(Index)uVar27,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,
                          &local_98);
      *(undefined8 *)(puVar23 + -8) = 0x37c0f3;
      puVar18 = (undefined8 *)operator_new(0x10);
      *(undefined4 *)(puVar18 + 1) = 1;
      *puVar18 = local_c8;
      *(Index *)((long)puVar18 + 0xc) = IVar12;
      *(undefined8 *)(puVar23 + -8) = 0x37c115;
      pTVar19 = (TypeCluster *)operator_new(0x38);
      *(undefined8 *)(puVar23 + -8) = 0x37c123;
      TypeCluster::TypeCluster(pTVar19,(Index)uVar24);
      tc = (TypeCluster *)puVar18;
      local_80 = pTVar19;
      *(undefined8 *)(puVar23 + -8) = 0x37c137;
      std::_Rb_tree<Type*,Type*,std::_Identity<Type*>,std::less<Type*>,std::allocator<Type*>>::
      _M_insert_unique<Type*const&>
                ((_Rb_tree<Type*,Type*,std::_Identity<Type*>,std::less<Type*>,std::allocator<Type*>>
                  *)pTVar19,(Type **)&tc);
      ppvVar5 = (this->_m_typeLists).
                super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_m_typeLists).
                        super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar5 >> 3) <= uVar25)
      {
        *(undefined8 *)(puVar23 + -8) = 0x37c3b2;
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar25);
      }
      this_00 = (vector<TypeCluster*,std::allocator<TypeCluster*>> *)ppvVar5[uVar25];
      __position._M_current = *(TypeCluster ***)(this_00 + 8);
      if (__position._M_current == *(TypeCluster ***)(this_00 + 0x10)) {
        *(undefined8 *)(puVar23 + -8) = 0x37c17a;
        std::vector<TypeCluster*,std::allocator<TypeCluster*>>::
        _M_realloc_insert<TypeCluster*const&>(this_00,__position,&local_80);
      }
      else {
        *__position._M_current = local_80;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      puVar6 = local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((TypeCluster *)
          local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (TypeCluster *)0x0) {
        uVar27 = (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                 (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)(puVar23 + -8) = 0x37c192;
        operator_delete(puVar6,uVar27);
      }
      auVar10 = auStack_58;
      if (auStack_58 != (undefined1  [8])0x0) {
        uVar27 = (long)indAOHs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58;
        *(undefined8 *)(puVar23 + -8) = 0x37c1a7;
        operator_delete((void *)auVar10,uVar27);
      }
      uVar24 = (ulong)((Index)uVar24 + 1);
      puVar16 = (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
                super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase._m_nrTypes.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff
                        .super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
                        _m_nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar16 >> 3) <= uVar25)
      goto LAB_0037c390;
    }
    uVar28 = uVar28 + 1;
  }
LAB_0037c390:
  *(undefined8 *)(puVar23 + -8) = 0x37c3a1;
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar25);
}

Assistant:

BayesianGameWithClusterInfo::BayesianGameWithClusterInfo(                
        const PlanningUnitDecPOMDPDiscrete* pu,
        const QFunctionJAOHInterface* q,
        const boost::shared_ptr<const PartialJointPolicyDiscretePure> &pastJPol,
        BGClusterAlgorithm clusterAlg
    )
        :
            BayesianGameForDecPOMDPStage(  pu, q, pastJPol ),
            _m_pBG()
            ,_m_qJB(dynamic_cast<const QFunctionJointBeliefInterface *>(q))
            ,_m_qHybrid(dynamic_cast<const QHybrid *>(q))
            ,_m_pBGJPol()
            ,_m_clusterAlgorithm(clusterAlg),
            _m_thresholdJB(0),
            _m_thresholdPjaoh(0)
{
    //extra stuff we need to do for cluster info...


    //Construct the individual type sets
    Index ts = GetStage();
    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        _m_typeLists.push_back( new TypeClusterList() );
        Index tcI = 0;
        Index fI = CastLIndexToIndex(GetPUDecPOMDPDiscrete()->GetFirstObservationHistoryIndex(agI, ts));
        for(Index typeI=0; typeI < GetNrTypes(agI); typeI++)
        {
            //the type corresponds to the observation history, offset by the
            //first ohI index for this stage
            Index ohI = typeI + fI;
            
            vector<Index> actions;
            vector<Index> observations;
            if(ts > 0)
            {
                Index obsArr[ts];
                Index acsArr[ts];
                GetPUDecPOMDPDiscrete()->GetObservationHistoryArrays(agI, ohI, ts, obsArr);
                Index ohI2 = 0;
                Index tI = 0;
                while(tI < ts)
                {
                    Index aI = pastJPol->GetActionIndex(agI, ohI2);
                    acsArr[tI] = aI;

                    Index next_oI = obsArr[tI];
                    ohI2 = GetPUDecPOMDPDiscrete()->GetSuccessorOHI(agI, ohI2, next_oI);
                    tI++;
                }
                actions = vector<Index>(acsArr[0], acsArr[ts-1]);
                observations = vector<Index>(obsArr[0], obsArr[ts-1]);
            }


            Index aohI = GetPUDecPOMDPDiscrete()->GetActionObservationHistoryIndex(agI, ts, 
                    actions, observations);
            Type_AOHIndex* t =  new Type_AOHIndex(aohI);
            TypeCluster* tc = new TypeCluster(tcI++);
            tc->AddType(t);
            ///store this type:
            _m_typeLists.at(agI)->push_back( tc );
        }
    }

    //on initialization we called BayesianGameForDecPOMDPStage(  pu, q, pastJPol ),
    //which is the public constructor of BayesianGameForDecPOMDPStage, which already
    //computed all joint types.
    //_m_JBs = vector< JointBeliefInterface* >(GetNrJointTypes());
    _m_jaohReps = vector< Index >( GetNrJointTypes() );

    //loop over joint types and store the joint beliefs.
    for(Index jtI=0; jtI < GetNrJointTypes(); jtI++)
    {
        //compute the jaohI
        const vector<Index>& indTypeIs = JointToIndividualTypeIndices(jtI);
        vector<Index> indAOHs(GetNrAgents());
        for(Index agI=0; agI < GetNrAgents(); agI++)
        {
            Index tI = indTypeIs.at(agI);
            TypeClusterList* tcl = _m_typeLists.at(agI);
            TypeCluster* tc =  tcl->at(tI);
            //we know there is just 1 element in this cluster (we just created
            //it above and only added 1 Type_AOHIndex )
            Type* t1 =  *(tc->begin());
            Type_AOHIndex* t =  dynamic_cast< Type_AOHIndex * >(t1);
            Index aohI = t->GetAOHIndex();
            indAOHs.at(agI) = aohI;
        }
        Index jaohI = IndividualToJointTypeIndices(indAOHs);
        _m_jaohReps.at(jtI) = jaohI;
        //the following returns a copy that should be deleted:
        //JointBeliefInterface* jb = GetPUDecPOMDPDiscrete()->GetJointBeliefInterface(jaohI);
        //_m_JBs.at(jtI) = jb;
    }


}